

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O2

void mv_bubble(level *lev,bubble *b,int dx,int dy,boolean ini)

{
  uint uVar1;
  container *pcVar2;
  obj *poVar3;
  monst *mtmp;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  byte *pbVar19;
  obj *otmp;
  char cVar20;
  xchar xVar21;
  char cVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  container *__ptr;
  
  if (dx - 2U < 0xfffffffd || dy - 2U < 0xfffffffd) {
    dx = sgn(dx);
    dy = sgn(dy);
  }
  xVar21 = b->x;
  cVar20 = b->y;
  uVar8 = (uint)xVar21;
  uVar1 = xmin + 1;
  uVar15 = (uint)cVar20;
  bVar5 = (int)uVar15 <= ymin + 1;
  bVar6 = xmax <= (int)(*b->bm + uVar8);
  bVar7 = ymax <= (int)(b->bm[1] + uVar15);
  if ((int)uVar8 <= xmin) {
    pline("bubble xmin: x = %d, xmin = %d",(ulong)uVar8,(ulong)uVar1);
    xVar21 = (char)xmin + '\x01';
    b->x = xVar21;
    cVar20 = b->y;
    uVar15 = (uint)cVar20;
  }
  if ((int)uVar15 <= ymin) {
    pline("bubble ymin: y = %d, ymin = %d",(ulong)uVar15,(ulong)(ymin + 1));
    cVar20 = (char)ymin + '\x01';
    b->y = cVar20;
    xVar21 = b->x;
  }
  pbVar19 = b->bm;
  iVar17 = xmax;
  if (xmax < (int)((uint)*pbVar19 + (int)xVar21)) {
    pline("bubble xmax: x = %d, xmax = %d",(ulong)(((uint)*pbVar19 + (int)xVar21) - 1),
          (ulong)(xmax - 1));
    iVar17 = xmax;
    pbVar19 = b->bm;
    xVar21 = (char)xmax - *pbVar19;
    b->x = xVar21;
    cVar20 = b->y;
  }
  iVar9 = (int)cVar20;
  iVar16 = (uint)pbVar19[1] + iVar9;
  iVar18 = ymax;
  if (ymax < iVar16) {
    pline("bubble ymax: y = %d, ymax = %d",(ulong)(iVar16 - 1),(ulong)(ymax - 1));
    iVar18 = ymax;
    pbVar19 = b->bm;
    cVar20 = (char)ymax - pbVar19[1];
    b->y = cVar20;
    xVar21 = b->x;
    iVar9 = (int)cVar20;
    iVar16 = (uint)pbVar19[1] + iVar9;
    iVar17 = xmax;
  }
  uVar15 = -dx;
  if (0 < dx) {
    uVar15 = dx;
  }
  if (xmin + 1 != (int)xVar21) {
    uVar15 = dx;
  }
  cVar22 = -(char)uVar15;
  if (0 < (int)uVar15) {
    cVar22 = (char)uVar15;
  }
  uVar11 = -dy;
  if (0 < dy) {
    uVar11 = dy;
  }
  if (ymin + 1 != iVar9) {
    uVar11 = dy;
  }
  uVar10 = -uVar11;
  if (0 < (int)uVar11) {
    uVar10 = uVar11;
  }
  uVar12 = (uint)(byte)-cVar22;
  if ((uint)*pbVar19 + (int)xVar21 != iVar17) {
    uVar12 = uVar15;
  }
  cVar22 = xVar21 + (char)uVar12;
  uVar15 = (uint)(byte)-(char)uVar10;
  if (iVar16 != iVar18) {
    uVar15 = uVar11;
  }
  b->x = cVar22;
  b->y = cVar20 + (char)uVar15;
  lVar25 = (long)cVar22;
  puVar14 = &lev->locations[lVar25][0].field_0x6;
  for (uVar11 = 0; uVar11 < *pbVar19; uVar11 = uVar11 + 1) {
    cVar20 = b->y;
    lVar24 = (long)(int)cVar20 * 0xc;
    puVar13 = puVar14;
    for (uVar23 = 0; uVar23 < pbVar19[1]; uVar23 = uVar23 + 1) {
      if ((1 << ((byte)uVar11 & 0x1f) & (uint)pbVar19[uVar23 + 2]) != 0) {
        puVar13[lVar24 + -2] = 0x25;
        puVar13[lVar24 + 1] = puVar13[lVar24 + 1] | 4;
        unblock_point((int)lVar25,(int)uVar23 + (int)cVar20);
        pbVar19 = b->bm;
      }
      puVar13 = puVar13 + 0xc;
    }
    lVar25 = lVar25 + 1;
    puVar14 = puVar14 + 0xfc;
  }
  __ptr = b->cons;
  while (__ptr != (container *)0x0) {
    pcVar2 = __ptr->next;
    cVar20 = __ptr->x + (char)uVar12;
    __ptr->x = cVar20;
    cVar22 = __ptr->y + (char)uVar15;
    __ptr->y = cVar22;
    switch(__ptr->what) {
    case 0:
      otmp = (obj *)__ptr->list;
      while (otmp != (obj *)0x0) {
        poVar3 = (otmp->v).v_nexthere;
        place_object(otmp,lev,(int)__ptr->x,(int)__ptr->y);
        otmp = poVar3;
      }
      break;
    case 1:
      mnearto((monst *)__ptr->list,cVar20,cVar22,'\x01');
      break;
    case 2:
      iVar18 = (int)u.ux;
      iVar17 = (int)u.uy;
      u.ux = cVar20;
      u.uy = cVar22;
      newsym(iVar18,iVar17);
      mtmp = lev->monsters[__ptr->x][__ptr->y];
      if ((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) {
        mnexto(mtmp);
      }
      break;
    case 3:
      pvVar4 = __ptr->list;
      *(char *)((long)pvVar4 + 9) = cVar20;
      *(char *)((long)pvVar4 + 10) = cVar22;
      break;
    default:
      impossible("mv_bubble: unknown bubble contents");
    }
    free(__ptr);
    __ptr = pcVar2;
  }
  b->cons = (container *)0x0;
  (*(code *)(&DAT_002a0338 +
            *(int *)(&DAT_002a0338 +
                    (ulong)((uint)(bVar7 || bVar5) + (uint)(bVar6 || (int)uVar8 <= (int)uVar1) * 2)
                    * 4)))();
  return;
}

Assistant:

static void mv_bubble(struct level *lev, struct bubble *b, int dx, int dy, boolean ini)
{
	int x, y, i, j, colli = 0;
	struct container *cons, *ctemp;

	/* move bubble */
	if (dx < -1 || dx > 1 || dy < -1 || dy > 1) {
	    /* pline("mv_bubble: dx = %d, dy = %d", dx, dy); */
	    dx = sgn(dx);
	    dy = sgn(dy);
	}

	/*
	 * collision with level borders?
	 *	1 = horizontal border, 2 = vertical, 3 = corner
	 */
	if (b->x <= bxmin) colli |= 2;
	if (b->y <= bymin) colli |= 1;
	if ((int) (b->x + b->bm[0] - 1) >= bxmax) colli |= 2;
	if ((int) (b->y + b->bm[1] - 1) >= bymax) colli |= 1;

	if (b->x < bxmin) {
	    pline("bubble xmin: x = %d, xmin = %d", b->x, bxmin);
	    b->x = bxmin;
	}
	if (b->y < bymin) {
	    pline("bubble ymin: y = %d, ymin = %d", b->y, bymin);
	    b->y = bymin;
	}
	if ((int) (b->x + b->bm[0] - 1) > bxmax) {
	    pline("bubble xmax: x = %d, xmax = %d",
			b->x + b->bm[0] - 1, bxmax);
	    b->x = bxmax - b->bm[0] + 1;
	}
	if ((int) (b->y + b->bm[1] - 1) > bymax) {
	    pline("bubble ymax: y = %d, ymax = %d",
			b->y + b->bm[1] - 1, bymax);
	    b->y = bymax - b->bm[1] + 1;
	}

	/* bounce if we're trying to move off the border */
	if (b->x == bxmin && dx < 0) dx = -dx;
	if (b->x + b->bm[0] - 1 == bxmax && dx > 0) dx = -dx;
	if (b->y == bymin && dy < 0) dy = -dy;
	if (b->y + b->bm[1] - 1 == bymax && dy > 0) dy = -dy;

	b->x += dx;
	b->y += dy;

	/* void positions inside bubble */

	for (i = 0, x = b->x; i < (int) b->bm[0]; i++, x++)
	    for (j = 0, y = b->y; j < (int) b->bm[1]; j++, y++)
		if (b->bm[j + 2] & (1 << i)) {
		    lev->locations[x][y].typ = AIR;
		    lev->locations[x][y].lit = 1;
		    unblock_point(x,y);
		}

	/* replace contents of bubble */
	for (cons = b->cons; cons; cons = ctemp) {
	    ctemp = cons->next;
	    cons->x += dx;
	    cons->y += dy;

	    switch(cons->what) {
		case CONS_OBJ: {
		    struct obj *olist, *otmp;

		    for (olist=(struct obj *)cons->list; olist; olist=otmp) {
			otmp = olist->nexthere;
			place_object(olist, lev, cons->x, cons->y);
		    }
		    break;
		}

		case CONS_MON: {
		    struct monst *mon = (struct monst *) cons->list;
		    mnearto(mon, cons->x, cons->y, TRUE);
		    break;
		}

		case CONS_HERO: {
		    int ux0 = u.ux, uy0 = u.uy;

		    /* change u.ux0 and u.uy0? */
		    u.ux = cons->x;
		    u.uy = cons->y;
		    newsym(ux0, uy0);	/* clean up old position */

		    if (MON_AT(lev, cons->x, cons->y)) {
				mnexto(m_at(lev, cons->x,cons->y));
			}
		    break;
		}

		case CONS_TRAP: {
		    struct trap *btrap = (struct trap *) cons->list;
		    btrap->tx = cons->x;
		    btrap->ty = cons->y;
		    break;
		}

		default:
		    impossible("mv_bubble: unknown bubble contents");
		    break;
	    }
	    free(cons);
	}
	b->cons = 0;

	/* boing? */

	switch (colli) {
	    case 1: b->dy = -b->dy;	break;
	    case 3: b->dy = -b->dy;	/* fall through */
	    case 2: b->dx = -b->dx;	break;
	    default:
		/* sometimes alter direction for fun anyway
		   (higher probability for stationary bubbles) */
		if (!ini && ((b->dx || b->dy) ? !rn2(20) : !rn2(5))) {
			b->dx = 1 - rn2(3);
			b->dy = 1 - rn2(3);
		}
	}
}